

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O3

void __thiscall
DelIRCCommand::trigger
          (DelIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  undefined8 uVar4;
  char *pcVar5;
  long *plVar6;
  ulong uVar7;
  bool bVar8;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  
  if (parameters._M_len != 0) {
    lVar2 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
    if (lVar2 == 0) {
      return;
    }
    Jupiter::IRC::Client::Channel::getType();
    RenX::getCore();
    lVar2 = RenX::Core::getServerCount();
    if (lVar2 != 0) {
      uVar7 = 1;
      do {
        uVar3 = RenX::getCore();
        uVar4 = RenX::Core::getServer(uVar3);
        cVar1 = RenX::Server::isLogChanType((int)uVar4);
        if (cVar1 != '\0') {
          lVar2 = RenX::Server::getPlayerByPartName(uVar4,parameters._M_len,parameters._M_str);
          if (lVar2 == 0) {
            cVar1 = Jupiter::Config::removeSection(0x118440,parameters._M_len,parameters._M_str);
            if ((cVar1 != '\0') && (cVar1 = Jupiter::Config::write(), cVar1 != '\0'))
            goto LAB_0010fd49;
            Jupiter::Plugin::getConfig();
            lVar2 = Jupiter::Config::getSections_abi_cxx11_();
            plVar6 = (long *)(lVar2 + 0x10);
            goto LAB_0010fcec;
          }
          if (*(char *)(lVar2 + 0x100) == '\x01') {
            pcVar5 = "Error: A bot can not be a moderator.";
          }
          else {
            cVar1 = Jupiter::Config::removeSection
                              (0x118440,*(undefined8 *)(lVar2 + 0x70),*(undefined8 *)(lVar2 + 0x68))
            ;
            if ((cVar1 != '\0') && (cVar1 = Jupiter::Config::write(), cVar1 != '\0')) {
              pcVar5 = "Player has been removed from the moderator list.";
              uVar4 = 0x30;
              goto LAB_0010fc2e;
            }
            pcVar5 = "Player is not in the moderator list.";
          }
          uVar4 = 0x24;
          goto LAB_0010fc2e;
        }
        RenX::getCore();
        uVar3 = RenX::Core::getServerCount();
        bVar8 = uVar3 != uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar8);
    }
    Jupiter::IRC::Client::sendMessage
              (source,channel._M_len,channel._M_str,0x40,
               "Error: Channel not attached to any connected Renegade X servers.");
    return;
  }
  pcVar5 = "Error: Too few parameters. Syntax: del <player>";
  uVar4 = 0x2f;
  goto LAB_0010fc2e;
  while( true ) {
    lhs = (basic_string_view<char,_std::char_traits<char>_>)
          Jupiter::Config::get(plVar6 + 5,4,"Name",0,0);
    bVar8 = jessilib::equalsi<char,char>(lhs,parameters);
    if (bVar8) break;
LAB_0010fcec:
    plVar6 = (long *)*plVar6;
    if (plVar6 == (long *)0x0) {
      pcVar5 = "Error: Player not found.";
      uVar4 = 0x18;
      goto LAB_0010fc2e;
    }
  }
  cVar1 = Jupiter::Config::removeSection(0x118440,plVar6[2],plVar6[1]);
  if ((cVar1 == '\0') || (cVar1 = Jupiter::Config::write(), cVar1 == '\0')) {
    pcVar5 = "Error: Unknown error occurred.";
    uVar4 = 0x1e;
  }
  else {
LAB_0010fd49:
    pcVar5 = "Player has been removed from the moderator list.";
    uVar4 = 0x30;
  }
LAB_0010fc2e:
  Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,uVar4,pcVar5);
  return;
}

Assistant:

void DelIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	std::string_view parameters_view = parameters;
	if (parameters.empty())
		source->sendNotice(nick, "Error: Too few parameters. Syntax: del <player>"sv);
	else
	{
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr)
		{
			RenX::Server *server;
			RenX::PlayerInfo *player;
			int type = chan->getType();
			bool serverMatch = false;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					serverMatch = true;
					player = server->getPlayerByPartName(parameters);
					if (player == nullptr)
					{
						if (pluginInstance.removeModSection(parameters))
							source->sendNotice(nick, "Player has been removed from the moderator list."sv);
						else
						{
							for (auto& section : pluginInstance.getConfig().getSections())
							{
								if (jessilib::equalsi(section.second.get("Name"sv), parameters_view)) {
									if (pluginInstance.removeModSection(section.first))
										source->sendNotice(nick, "Player has been removed from the moderator list."sv);
									else
										source->sendNotice(nick, "Error: Unknown error occurred."sv);

									return;
								}
							}

							source->sendNotice(nick, "Error: Player not found."sv);
						}
					}
					else if (player->isBot)
						source->sendNotice(nick, "Error: A bot can not be a moderator."sv);
					else if (pluginInstance.removeModSection(player->uuid))
						source->sendNotice(nick, "Player has been removed from the moderator list."sv);
					else
						source->sendNotice(nick, "Player is not in the moderator list."sv);

					break;
				}
			}
			if (serverMatch == false)
				source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
}